

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O0

void absl::ascii_internal::AsciiStrCaseFold<false>
               (Nonnull<char_*> dst,Nonnull<const_char_*> src,size_t size)

{
  byte c;
  bool bVar1;
  byte bVar2;
  Nonnull<const_char_*> in_RDX;
  Nonnull<char_*> in_RSI;
  long in_RDI;
  uchar v;
  size_t i;
  uchar kAsciiCaseBitFlip;
  Nonnull<const_char_*> local_28;
  
  if (in_RDX < (Nonnull<const_char_*>)0x10) {
    for (local_28 = (Nonnull<const_char_*>)0x0; local_28 < in_RDX; local_28 = local_28 + 1) {
      c = in_RSI[(long)local_28];
      bVar1 = AsciiInAZRange<false>(c);
      bVar2 = 0;
      if (bVar1) {
        bVar2 = 0x20;
      }
      local_28[in_RDI] = c ^ bVar2;
    }
  }
  else {
    AsciiStrCaseFoldLong<false>(in_RSI,in_RDX,0x3996bf);
  }
  return;
}

Assistant:

constexpr void AsciiStrCaseFold(absl::Nonnull<char*> dst,
                                absl::Nonnull<const char*> src, size_t size) {
  size < kCaseFoldThreshold ? AsciiStrCaseFoldImpl<ToUpper>(dst, src, size)
                            : AsciiStrCaseFoldLong<ToUpper>(dst, src, size);
}